

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
google::protobuf::Reflection::VerifyFieldType<google::protobuf::RepeatedField<double>>
          (Reflection *this,FieldDescriptor *field)

{
  Nullable<const_char_*> pcVar1;
  int v1;
  LogMessage local_40;
  anon_class_8_1_a7e8901a error;
  string local_28;
  FieldDescriptor *field_local;
  
  error.field = &field_local;
  field_local = field;
  local_28._M_dataplus._M_p._0_1_ = FieldDescriptor::is_repeated(field);
  pcVar1 = absl::lts_20250127::log_internal::Check_EQImpl<bool,std::integral_constant<bool,true>>
                     ((bool *)&local_28,
                      (integral_constant<bool,_true> *)
                      &internal::IsRepeatedT<google::protobuf::RepeatedField<double>>,
                      "field->is_repeated() == internal::IsRepeatedT<T>");
  if (pcVar1 == (Nullable<const_char_*>)0x0) {
    v1 = 1;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_local->type_ * 4) != 8) {
      v1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_local->type_ * 4);
    }
    pcVar1 = absl::lts_20250127::log_internal::Check_EQImpl
                       (v1,5,"+cpp_type == +internal::GetCppType<T>()");
    if (pcVar1 == (Nullable<const_char_*>)0x0) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6bf,pcVar1);
    const::{lambda()#1}::operator()[abi_cxx11_(&local_28,&error);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_28);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6b3,pcVar1);
    const::{lambda()#1}::operator()[abi_cxx11_(&local_28,&error);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}